

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.h
# Opt level: O2

Vector6d * gmath::combine(Vector6d *__return_storage_ptr__,Vector6d *pose0,Vector6d *pose1)

{
  Vector3d T;
  Matrix33d R;
  SVector<double,_3> local_138;
  SVector<double,_3> local_120;
  Matrix33d local_108;
  SMatrix<double,_3,_3> local_b8;
  Matrix33d local_70;
  
  getRotation(&local_70,pose0);
  local_108.v[0][2] = pose1->v[2];
  local_108.v[0][0] = pose1->v[0];
  local_108.v[0][1] = pose1->v[1];
  SMatrix<double,_3,_3>::operator*
            ((SVector<double,_3> *)&local_b8,&local_70,(SVector<double,_3> *)&local_108);
  local_138.v[2] = pose0->v[2];
  local_138.v[0] = pose0->v[0];
  local_138.v[1] = pose0->v[1];
  SVector<double,_3>::operator+(&local_120,(SVector<double,_3> *)&local_b8,&local_138);
  getRotation(&local_108,pose1);
  operator*(&local_b8,&local_70,&local_108);
  SMatrix<double,_3,_3>::operator=(&local_70,&local_b8);
  getPose(__return_storage_ptr__,&local_70,&local_120);
  return __return_storage_ptr__;
}

Assistant:

inline Vector6d combine(const Vector6d &pose0, const Vector6d &pose1)
{
  Matrix33d R=getRotation(pose0);
  Vector3d  T=R*getTranslation(pose1)+getTranslation(pose0);
  R=R*getRotation(pose1);
  return getPose(R, T);
}